

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O2

char * Wlc_PrsConvertInitValues(Wlc_Ntk_t *p)

{
  byte Entry;
  int iVar1;
  uint uVar2;
  Vec_Str_t *p_00;
  char *pcVar3;
  Wlc_Obj_t *p_01;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  p_00 = (Vec_Str_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  pcVar3 = (char *)malloc(1000);
  p_00->pArray = pcVar3;
  lVar7 = 0;
  do {
    if (p->vInits->nSize <= lVar7) {
      Vec_StrPush(p_00,'\0');
      pcVar3 = p_00->pArray;
      free(p_00);
      return pcVar3;
    }
    iVar1 = Vec_IntEntry(p->vInits,(int)lVar7);
    if (iVar1 < 0) {
      for (; iVar1 != 0; iVar1 = iVar1 + 1) {
        Vec_StrPush(p_00,'0');
      }
    }
    else {
      p_01 = Wlc_NtkObj(p,iVar1);
      uVar5 = (p_01->End - p_01->Beg) + 1;
      while ((*(ushort *)p_01 & 0x3f) == 7) {
        piVar4 = Wlc_ObjFanins(p_01);
        p_01 = Wlc_NtkObj(p,*piVar4);
      }
      if ((*(ushort *)p_01 & 0x3f) == 6) {
        piVar4 = Wlc_ObjFanins(p_01);
      }
      else {
        piVar4 = (int *)0x0;
      }
      uVar6 = 0;
      while( true ) {
        uVar2 = (p_01->End - p_01->Beg) + 1;
        if ((int)uVar5 < (int)uVar2) {
          uVar2 = uVar5;
        }
        if ((int)uVar2 <= (int)uVar6) break;
        if (piVar4 == (int *)0x0) {
          Entry = 0x58;
        }
        else {
          Entry = ((uint)piVar4[uVar6 >> 5] >> (uVar6 & 0x1f) & 1) != 0 | 0x30;
        }
        Vec_StrPush(p_00,Entry);
        uVar6 = uVar6 + 1;
      }
      uVar2 = uVar5;
      if ((int)uVar5 < (int)uVar6) {
        uVar2 = uVar6;
      }
      for (; uVar6 != uVar2; uVar2 = uVar2 - 1) {
        Vec_StrPush(p_00,'0');
      }
      if (piVar4 == (int *)0x0) {
        if ((undefined1  [24])((undefined1  [24])*p_01 & (undefined1  [24])0x3d) !=
            (undefined1  [24])0x1) {
          __assert_fail("Wlc_ObjIsCi(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlc.h"
                        ,0xaa,"int Wlc_ObjCiId(Wlc_Obj_t *)");
        }
        iVar1 = (p_01->field_8).Fanins[1];
      }
      else {
        iVar1 = -uVar5;
      }
      if (p->vInits->nSize <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p->vInits->pArray[lVar7] = iVar1;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

char * Wlc_PrsConvertInitValues( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj; 
    int i, k, Value, * pInits;
    char * pResult;
    Vec_Str_t * vStr = Vec_StrAlloc( 1000 );
    Vec_IntForEachEntry( p->vInits, Value, i )
    {
        if ( Value < 0 )
        {
            for ( k = 0; k < -Value; k++ )
                Vec_StrPush( vStr, '0' );
            continue;
        }
        pObj = Wlc_NtkObj( p, Value );
        Value = Wlc_ObjRange(pObj);
        while ( pObj->Type == WLC_OBJ_BUF )
            pObj = Wlc_NtkObj( p, Wlc_ObjFaninId0(pObj) );
        pInits = pObj->Type == WLC_OBJ_CONST ? Wlc_ObjConstValue(pObj) : NULL;
        for ( k = 0; k < Abc_MinInt(Value, Wlc_ObjRange(pObj)); k++ )
            Vec_StrPush( vStr, (char)(pInits ? '0' + Abc_InfoHasBit((unsigned *)pInits, k) : 'X') );
        // extend values with zero, in case the init value signal has different range compared to constant used
        for ( ; k < Value; k++ )
            Vec_StrPush( vStr, '0' );
        // update vInits to contain either number of values or PI index
        Vec_IntWriteEntry( p->vInits, i, pInits ? -Value : Wlc_ObjCiId(pObj) );
    }
    Vec_StrPush( vStr, '\0' );
    pResult = Vec_StrReleaseArray( vStr );
    Vec_StrFree( vStr );
    return pResult;
}